

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O3

WebPMux * WebPMuxCreateInternal(WebPData *bitstream,int copy_data,int version)

{
  ulong riff_size;
  uint32_t uVar1;
  int *piVar2;
  ulong uVar3;
  WebPMuxError WVar4;
  WebPChunkId id;
  int iVar5;
  WebPMux *mux;
  WebPMuxImage *wpi;
  WebPChunk **ppWVar6;
  int *data;
  WebPChunk ***chunk_list;
  size_t data_size;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  WebPChunk chunk;
  WebPChunk **chunk_list_ends [11];
  WebPChunk local_a8;
  WebPChunk **local_88 [11];
  
  local_88[8] = (WebPChunk **)0x0;
  local_88[9] = (WebPChunk **)0x0;
  local_88[6] = (WebPChunk **)0x0;
  local_88[7] = (WebPChunk **)0x0;
  local_88[4] = (WebPChunk **)0x0;
  local_88[5] = (WebPChunk **)0x0;
  local_88[2] = (WebPChunk **)0x0;
  local_88[3] = (WebPChunk **)0x0;
  local_88[0] = (WebPChunk **)0x0;
  local_88[1] = (WebPChunk **)0x0;
  local_88[10] = (WebPChunk **)0x0;
  ChunkInit(&local_a8);
  if (bitstream == (WebPData *)0x0 || (version & 0xffffff00U) != 0x100) {
    return (WebPMux *)0x0;
  }
  piVar2 = (int *)bitstream->bytes;
  uVar3 = bitstream->size;
  if (uVar3 < 0x14 || piVar2 == (int *)0x0) {
    return (WebPMux *)0x0;
  }
  if (*piVar2 != 0x46464952) {
    return (WebPMux *)0x0;
  }
  if (piVar2[2] != 0x50424557) {
    return (WebPMux *)0x0;
  }
  mux = WebPNewInternal(0x109);
  if (mux == (WebPMux *)0x0) {
    return (WebPMux *)0x0;
  }
  uVar1 = piVar2[3];
  if ((((uVar1 == 0x20385056) || (uVar1 == 0x4c385056)) || (uVar1 == 0x58385056)) &&
     (uVar7 = piVar2[1], uVar7 < 0xfffffff7)) {
    uVar9 = (ulong)(uVar7 + 1 & 0xfffffffe);
    riff_size = uVar9 + 8;
    if ((riff_size <= uVar3 && 2 < uVar7) &&
       (wpi = (WebPMuxImage *)WebPSafeMalloc(1,0x38), wpi != (WebPMuxImage *)0x0)) {
      MuxImageInit(wpi);
      if (riff_size != 0xc) {
        data = piVar2 + 3;
        data_size = uVar9 - 4;
        do {
          WVar4 = ChunkVerifyAndAssign(&local_a8,(uint8_t *)data,data_size,riff_size,copy_data);
          if (WVar4 != WEBP_MUX_OK) goto LAB_0014f36d;
          uVar7 = (int)local_a8.data.size + 1U & 0xfffffffe;
          id = ChunkGetIdFromTag(local_a8.tag);
          if (id == WEBP_CHUNK_ANMF) {
            if ((wpi->is_partial != 0) ||
               (iVar5 = MuxImageParse(&local_a8,copy_data,wpi), iVar5 == 0)) goto LAB_0014f36d;
            ChunkRelease(&local_a8);
LAB_0014f4b3:
            WVar4 = MuxImagePush(wpi,&mux->images);
            if (WVar4 != WEBP_MUX_OK) goto LAB_0014f36d;
            MuxImageInit(wpi);
          }
          else {
            if (id == WEBP_CHUNK_IMAGE) {
              WVar4 = ChunkSetHead(&local_a8,&wpi->img);
              if ((WVar4 == WEBP_MUX_OK) && (iVar5 = MuxImageFinalize(wpi), iVar5 != 0)) {
                wpi->is_partial = 0;
                goto LAB_0014f4b3;
              }
              goto LAB_0014f36d;
            }
            if (id == WEBP_CHUNK_ALPHA) {
              if ((wpi->alpha != (WebPChunk *)0x0) ||
                 (WVar4 = ChunkSetHead(&local_a8,&wpi->alpha), WVar4 != WEBP_MUX_OK))
              goto LAB_0014f36d;
              wpi->is_partial = 1;
            }
            else {
              if (wpi->is_partial != 0) goto LAB_0014f36d;
              chunk_list = local_88 + id;
              if (*chunk_list == (WebPChunk **)0x0) {
                ppWVar6 = MuxGetChunkListFromId(mux,id);
                *chunk_list = ppWVar6;
              }
              WVar4 = ChunkAppend(&local_a8,chunk_list);
              if (WVar4 != WEBP_MUX_OK) goto LAB_0014f36d;
              if (id == WEBP_CHUNK_VP8X) {
                if (uVar7 < 10) goto LAB_0014f36d;
                mux->canvas_width =
                     (uint)*(ushort *)(data + 3) + (uint)*(byte *)((long)data + 0xe) * 0x10000 + 1;
                mux->canvas_height =
                     (uint)*(ushort *)((long)data + 0xf) +
                     (uint)*(byte *)((long)data + 0x11) * 0x10000 + 1;
              }
            }
          }
          lVar8 = (ulong)uVar7 + 8;
          data = (int *)((long)data + lVar8);
          data_size = data_size - lVar8;
          ChunkInit(&local_a8);
        } while (data != (int *)((long)piVar2 + riff_size));
      }
      if ((wpi->is_partial == 0) && (WVar4 = MuxValidate(mux), WVar4 == WEBP_MUX_OK)) {
        MuxImageDelete(wpi);
        return mux;
      }
      goto LAB_0014f36d;
    }
  }
  wpi = (WebPMuxImage *)0x0;
LAB_0014f36d:
  ChunkRelease(&local_a8);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return (WebPMux *)0x0;
}

Assistant:

WebPMux* WebPMuxCreateInternal(const WebPData* bitstream, int copy_data,
                               int version) {
  size_t riff_size;
  uint32_t tag;
  const uint8_t* end;
  WebPMux* mux = NULL;
  WebPMuxImage* wpi = NULL;
  const uint8_t* data;
  size_t size;
  WebPChunk chunk;
  // Stores the end of the chunk lists so that it is faster to append data to
  // their ends.
  WebPChunk** chunk_list_ends[WEBP_CHUNK_NIL + 1] = { NULL };
  ChunkInit(&chunk);

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_MUX_ABI_VERSION)) {
    return NULL;  // version mismatch
  }
  if (bitstream == NULL) return NULL;

  data = bitstream->bytes;
  size = bitstream->size;

  if (data == NULL) return NULL;
  if (size < RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE) return NULL;
  if (GetLE32(data + 0) != MKFOURCC('R', 'I', 'F', 'F') ||
      GetLE32(data + CHUNK_HEADER_SIZE) != MKFOURCC('W', 'E', 'B', 'P')) {
    return NULL;
  }

  mux = WebPMuxNew();
  if (mux == NULL) return NULL;

  tag = GetLE32(data + RIFF_HEADER_SIZE);
  if (tag != kChunks[IDX_VP8].tag &&
      tag != kChunks[IDX_VP8L].tag &&
      tag != kChunks[IDX_VP8X].tag) {
    goto Err;  // First chunk should be VP8, VP8L or VP8X.
  }

  riff_size = GetLE32(data + TAG_SIZE);
  if (riff_size > MAX_CHUNK_PAYLOAD) goto Err;

  // Note this padding is historical and differs from demux.c which does not
  // pad the file size.
  riff_size = SizeWithPadding(riff_size);
  // Make sure the whole RIFF header is available.
  if (riff_size < RIFF_HEADER_SIZE) goto Err;
  if (riff_size > size) goto Err;
  // There's no point in reading past the end of the RIFF chunk. Note riff_size
  // includes CHUNK_HEADER_SIZE after SizeWithPadding().
  if (size > riff_size) {
    size = riff_size;
  }

  end = data + size;
  data += RIFF_HEADER_SIZE;
  size -= RIFF_HEADER_SIZE;

  wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*wpi));
  if (wpi == NULL) goto Err;
  MuxImageInit(wpi);

  // Loop over chunks.
  while (data != end) {
    size_t data_size;
    WebPChunkId id;
    if (ChunkVerifyAndAssign(&chunk, data, size, riff_size,
                             copy_data) != WEBP_MUX_OK) {
      goto Err;
    }
    data_size = ChunkDiskSize(&chunk);
    id = ChunkGetIdFromTag(chunk.tag);
    switch (id) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha != NULL) goto Err;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&chunk, &wpi->alpha) != WEBP_MUX_OK) goto Err;
        wpi->is_partial = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (ChunkSetHead(&chunk, &wpi->img) != WEBP_MUX_OK) goto Err;
        if (!MuxImageFinalize(wpi)) goto Err;
        wpi->is_partial = 0;  // wpi is completely filled.
 PushImage:
        // Add this to mux->images list.
        if (MuxImagePush(wpi, &mux->images) != WEBP_MUX_OK) goto Err;
        MuxImageInit(wpi);  // Reset for reading next image.
        break;
      case WEBP_CHUNK_ANMF:
        if (wpi->is_partial) goto Err;  // Previous wpi is still incomplete.
        if (!MuxImageParse(&chunk, copy_data, wpi)) goto Err;
        ChunkRelease(&chunk);
        goto PushImage;
      default:  // A non-image chunk.
        if (wpi->is_partial) goto Err;  // Encountered a non-image chunk before
                                         // getting all chunks of an image.
        if (chunk_list_ends[id] == NULL) {
          chunk_list_ends[id] =
              MuxGetChunkListFromId(mux, id);  // List to add this chunk.
        }
        if (ChunkAppend(&chunk, &chunk_list_ends[id]) != WEBP_MUX_OK) goto Err;
        if (id == WEBP_CHUNK_VP8X) {  // grab global specs
          if (data_size < CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE) goto Err;
          mux->canvas_width = GetLE24(data + 12) + 1;
          mux->canvas_height = GetLE24(data + 15) + 1;
        }
        break;
    }
    data += data_size;
    size -= data_size;
    ChunkInit(&chunk);
  }

  // Incomplete image.
  if (wpi->is_partial) goto Err;

  // Validate mux if complete.
  if (MuxValidate(mux) != WEBP_MUX_OK) goto Err;

  MuxImageDelete(wpi);
  return mux;  // All OK;

 Err:  // Something bad happened.
  ChunkRelease(&chunk);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return NULL;
}